

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

string * helics::errorMessageString_abi_cxx11_(ActionMessage *command)

{
  bool bVar1;
  string *__str;
  ActionMessage *in_RSI;
  string *in_RDI;
  string *estring;
  undefined8 in_stack_ffffffffffffffb0;
  int iVar2;
  ActionMessage *in_stack_ffffffffffffffb8;
  string *this;
  allocator<char> *in_stack_ffffffffffffffe0;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  this = in_RDI;
  bVar1 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(in_RSI,error_flag);
  if (bVar1) {
    __str = ActionMessage::getString_abi_cxx11_(in_stack_ffffffffffffffb8,iVar2);
    iVar2 = (int)((ulong)this >> 0x20);
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5cc98e);
    if (bVar1) {
      commandErrorString(iVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                 (char *)__str,in_stack_ffffffffffffffe0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
    }
    else {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    }
  }
  else {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  }
  return in_RDI;
}

Assistant:

std::string errorMessageString(const ActionMessage& command)
{
    if (checkActionFlag(command, error_flag)) {
        const auto& estring = command.getString(0);
        if (estring.empty()) {
            return commandErrorString(command.messageID);
        }
        return estring;
    }
    return std::string{};
}